

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fault.cc
# Opt level: O1

void __thiscall
fault_produce_cov_xml_Test::~fault_produce_cov_xml_Test(fault_produce_cov_xml_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(fault, produce_cov_xml) {  // NOLINT
    const std::string filename = "cov.dat";
    Context c;
    auto iter = create_verilator_mod(c);
    auto &mod = iter.first;

    generate_verilog(&mod);
    // fake the output
    mod.verilog_fn = "mod.sv";

    auto coverage = parse_verilator_coverage(&mod, filename);
    auto run = std::make_shared<SimulationRun>(&mod);
    run->add_simulation_coverage(coverage);
    FaultAnalyzer fault(&mod);
    fault.add_simulation_run(run);
    fault.compute_fault_stmts_from_coverage();

    std::stringstream stream;
    fault.output_coverage_xml(stream);
    auto content = stream.str();

    // make sure both if statements and assignments are covered
    auto seq = iter.second;
    auto if_ = seq->get_stmt(0)->as<IfStmt>();
    auto if_then_ln = if_->then_body()->fn_name_ln.front().second;
    auto if_else_ln = if_->else_body()->fn_name_ln.front().second;
    auto then_assign_ = if_->then_body()->get_stmt(0)->fn_name_ln.front().second;
    auto else_assign_ = if_->else_body()->get_stmt(0)->fn_name_ln.front().second;
    auto lns = {if_then_ln, if_else_ln, then_assign_, else_assign_};
    for (auto const &ln : lns) {
        EXPECT_TRUE(content.find(::format("number=\"{0}\" hits=\"1\"", ln)) != std::string::npos);
    }
}